

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::Config_testDefaultSamplingServerURL_Test::TestBody
          (Config_testDefaultSamplingServerURL_Test *this)

{
  char *pcVar1;
  allocator local_416;
  allocator local_415;
  allocator local_414;
  allocator local_413;
  allocator local_412;
  allocator local_411;
  AssertionResult gtest_ar;
  duration local_400;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_3f8;
  string local_3e0 [32];
  string local_3c0;
  string local_3a0;
  duration local_380;
  string local_378;
  string local_358;
  string local_338;
  undefined1 local_318 [40];
  duration local_2f0;
  HeadersConfig local_2e8;
  Config local_268;
  Config local_210;
  Config local_1b8;
  
  std::__cxx11::string::string((string *)&local_358,"remote",&local_411);
  std::__cxx11::string::string((string *)&local_378,"http://127.0.0.1:5778/sampling",&local_412);
  local_380.__r = 60000000000;
  samplers::Config::Config(&local_210,&local_358,0.001,&local_378,2000,&local_380);
  local_400.__r = 10000000000;
  std::__cxx11::string::string((string *)&local_3a0,"127.0.0.1:6831",&local_413);
  std::__cxx11::string::string((string *)&local_3c0,"",&local_414);
  reporters::Config::Config(&local_268,100,&local_400,false,&local_3a0,&local_3c0);
  propagation::HeadersConfig::HeadersConfig(&local_2e8);
  std::__cxx11::string::string(local_3e0,"",&local_415);
  local_318[0] = false;
  std::__cxx11::string::string((string *)(local_318 + 8),local_3e0);
  local_2f0.__r = 0;
  pcVar1 = "";
  std::__cxx11::string::string((string *)&local_338,"",&local_416);
  local_3f8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Config::Config(&local_1b8,false,&local_210,&local_268,&local_2e8,(RestrictionsConfig *)local_318,
                 &local_338,&local_3f8);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"http://127.0.0.1:5778/sampling\"",
             "Config().sampler().samplingServerURL()",
             (char (*) [31])"http://127.0.0.1:5778/sampling",&local_1b8._sampler._samplingServerURL)
  ;
  Config::~Config(&local_1b8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_3f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)(local_318 + 8));
  std::__cxx11::string::~string(local_3e0);
  propagation::HeadersConfig::~HeadersConfig(&local_2e8);
  reporters::Config::~Config(&local_268);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  samplers::Config::~Config(&local_210);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_358);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x52,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Config, testDefaultSamplingServerURL)
{
    ASSERT_EQ("http://127.0.0.1:5778/sampling",
              Config().sampler().samplingServerURL());
}